

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mstring.c
# Opt level: O0

uint strnshash(char *s)

{
  ushort **ppuVar1;
  uint local_14;
  char *pcStack_10;
  uint h;
  char *s_local;
  
  local_14 = 0;
  for (pcStack_10 = s; *pcStack_10 != '\0'; pcStack_10 = pcStack_10 + 1) {
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)*pcStack_10] & 0x2000) == 0) {
      local_14 = local_14 * 0x1f + (int)*pcStack_10;
    }
  }
  return local_14;
}

Assistant:

unsigned int strnshash(const char *s)
{
unsigned int	h = 0;

    while (*s) {
	if (!isspace(*s))
	    h = (h<<5) - h + *s;
	s++; }
    return h;
}